

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::make(TranslateToFuzzReader *this,Type type)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  Fatal *pFVar4;
  char local_22d [13];
  Fatal local_220;
  TranslateToFuzzReader *local_98;
  uintptr_t local_90;
  BasicType local_88 [2];
  TranslateToFuzzReader *local_80;
  Expression *local_78;
  Expression *ret;
  BasicType local_64;
  TranslateToFuzzReader *local_60;
  TranslateToFuzzReader *local_58;
  BasicType local_4c;
  TranslateToFuzzReader *local_48;
  TranslateToFuzzReader *local_40;
  uintptr_t local_38;
  uintptr_t local_30;
  uintptr_t local_28;
  TranslateToFuzzReader *local_20;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_30 = type.id;
  local_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  local_38 = (uintptr_t)getSubType(this,type);
  local_28 = local_38;
  this_local = (TranslateToFuzzReader *)local_38;
  if (this->trivialNesting == 0) {
    bVar2 = Random::finished(&this->random);
    if (((bVar2) ||
        (iVar1 = (this->fuzzParams->super_FuzzParams).NESTING_LIMIT,
        SBORROW4(this->nesting,iVar1 * 5) == this->nesting + iVar1 * -5 < 0)) ||
       (((this->fuzzParams->super_FuzzParams).NESTING_LIMIT <= this->nesting &&
        (bVar2 = oneIn(this,3), !bVar2)))) {
      bVar2 = Type::isConcrete((Type *)&this_local);
      if (bVar2) {
        bVar2 = oneIn(this,2);
        if (bVar2) {
          local_40 = this_local;
          type_local.id = (uintptr_t)makeConst(this,(Type)this_local);
        }
        else {
          local_48 = this_local;
          type_local.id = (uintptr_t)makeLocalGet(this,(Type)this_local);
        }
      }
      else {
        local_4c = none;
        bVar2 = Type::operator==((Type *)&this_local,&local_4c);
        if (bVar2) {
          bVar2 = oneIn(this,2);
          if (bVar2) {
            local_58 = this_local;
            type_local.id = (uintptr_t)makeNop(this,(Type)this_local);
          }
          else {
            local_60 = this_local;
            type_local.id = (uintptr_t)makeLocalSet(this,(Type)this_local);
          }
        }
        else {
          local_64 = unreachable;
          bVar2 = Type::operator==((Type *)&this_local,&local_64);
          if (!bVar2) {
            __assert_fail("type == Type::unreachable",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                          ,0x81e,"Expression *wasm::TranslateToFuzzReader::make(Type)");
          }
          ret = (Expression *)this_local;
          type_local.id = (uintptr_t)makeTrivial(this,(Type)this_local);
        }
      }
    }
    else {
      this->nesting = this->nesting + 1;
      local_78 = (Expression *)0x0;
      bVar2 = Type::isConcrete((Type *)&this_local);
      if (bVar2) {
        local_80 = this_local;
        local_78 = _makeConcrete(this,(Type)this_local);
      }
      else {
        local_88[1] = 0;
        bVar2 = Type::operator==((Type *)&this_local,local_88 + 1);
        if (bVar2) {
          local_78 = _makenone(this);
        }
        else {
          local_88[0] = unreachable;
          bVar2 = Type::operator==((Type *)&this_local,local_88);
          if (!bVar2) {
            __assert_fail("type == Type::unreachable",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                          ,0x828,"Expression *wasm::TranslateToFuzzReader::make(Type)");
          }
          local_78 = _makeunreachable(this);
        }
      }
      local_90 = (local_78->type).id;
      local_98 = this_local;
      uVar3 = wasm::Type::isSubType((Type)local_90,(Type)this_local);
      if ((uVar3 & 1) == 0) {
        Fatal::Fatal(&local_220);
        pFVar4 = Fatal::operator<<(&local_220,
                                   (char (*) [39])"Did not generate the right subtype of ");
        pFVar4 = Fatal::operator<<(pFVar4,(Type *)&this_local);
        pFVar4 = Fatal::operator<<(pFVar4,(char (*) [19])", instead we have ");
        pFVar4 = Fatal::operator<<(pFVar4,&local_78->type);
        pFVar4 = Fatal::operator<<(pFVar4,(char (*) [4])" : ");
        pFVar4 = Fatal::operator<<(pFVar4,local_78);
        local_22d[0] = '\n';
        Fatal::operator<<(pFVar4,local_22d);
        Fatal::~Fatal(&local_220);
      }
      this->nesting = this->nesting + -1;
      type_local.id = (uintptr_t)local_78;
    }
  }
  else {
    type_local.id = (uintptr_t)makeTrivial(this,(Type)local_38);
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::make(Type type) {
  type = getSubType(type);
  if (trivialNesting) {
    // We are nested under a makeTrivial call, so only emit something trivial.
    return makeTrivial(type);
  }
  // When we should stop, emit something small (but not necessarily trivial).
  if (random.finished() ||
      nesting >= 5 * fuzzParams->NESTING_LIMIT || // hard limit
      (nesting >= fuzzParams->NESTING_LIMIT && !oneIn(3))) {
    if (type.isConcrete()) {
      if (oneIn(2)) {
        return makeConst(type);
      } else {
        return makeLocalGet(type);
      }
    } else if (type == Type::none) {
      if (oneIn(2)) {
        return makeNop(type);
      } else {
        return makeLocalSet(type);
      }
    }
    assert(type == Type::unreachable);
    return makeTrivial(type);
  }
  nesting++;
  Expression* ret = nullptr;
  if (type.isConcrete()) {
    ret = _makeConcrete(type);
  } else if (type == Type::none) {
    ret = _makenone();
  } else {
    assert(type == Type::unreachable);
    ret = _makeunreachable();
  }
  if (!Type::isSubType(ret->type, type)) {
    Fatal() << "Did not generate the right subtype of " << type
            << ", instead we have " << ret->type << " : " << *ret << '\n';
  }
  nesting--;
  return ret;
}